

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delaunay.c
# Opt level: O2

GLsizei getNumberOfTriangles(DelaunayTriangulation *delTri)

{
  uint uVar1;
  void *__ptr;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  GLsizei GVar5;
  Edge *pEVar6;
  ulong uVar7;
  
  GVar5 = 0;
  if ((2 < delTri->n_points) && (GVar5 = 0, delTri->success != 0)) {
    uVar1 = delTri->n_edges;
    __ptr = calloc((long)(int)uVar1,1);
    uVar2 = 0;
    uVar3 = 0;
    if (0 < (int)uVar1) {
      uVar3 = (ulong)uVar1;
    }
    iVar4 = 0;
    for (; uVar2 != uVar3; uVar2 = uVar2 + 1) {
      if ((delTri->edges[uVar2].discarded == 0) && (*(char *)((long)__ptr + uVar2) == '\0')) {
        pEVar6 = delTri->edges + uVar2;
        uVar7 = (ulong)(uint)pEVar6->idx;
        do {
          *(undefined1 *)((long)__ptr + (long)(int)uVar7) = 1;
          pEVar6 = pEVar6->onext->sym;
          uVar7 = (ulong)(uint)pEVar6->idx;
        } while (uVar2 != uVar7);
        iVar4 = iVar4 + 1;
      }
    }
    free(__ptr);
    GVar5 = iVar4 + -1;
  }
  return GVar5;
}

Assistant:

GLsizei getNumberOfTriangles(DelaunayTriangulation *delTri) {
	if ((delTri->n_points < 3) || (!delTri->success)) {
		return 0;
	}
	char *visited_edges = calloc(delTri->n_edges, sizeof(char));
	GLsizei n_triangles = 0;
	Edge *e;

	for (GLsizei i = 0; i < delTri->n_edges; i++) {
		e = &(delTri->edges[i]);
		if ((!e->discarded) && (visited_edges[i] == 0)) {
			do {
				visited_edges[e->idx] = 1;
				e = e->onext->sym;
			} while (e->idx != i);
			n_triangles ++;
		}
	}

	if (visited_edges != NULL) free(visited_edges);

	return n_triangles - 1; // Remove the "outside"

}